

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O0

void __thiscall xLearn::Predictor::Predict(Predictor *this)

{
  pointer pfVar1;
  const_iterator __position;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  vector<float,_std::allocator<float>_> *siglen;
  Predictor *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  float extraout_XMM0_Da;
  float fVar8;
  index_t i;
  ofstream o_file_1;
  index_t tmp;
  DMatrix *matrix;
  ofstream o_file;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb58;
  string *psVar9;
  ostream *in_stack_fffffffffffffb60;
  string local_478 [24];
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffba0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffba8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  uint in_stack_fffffffffffffbbc;
  undefined1 local_440 [136];
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc50;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc58;
  Predictor *in_stack_fffffffffffffc60;
  long local_210;
  undefined1 local_208 [520];
  
  if ((in_RDI->res_out_ & 1U) != 0) {
    std::ofstream::ofstream(local_208,(string *)&in_RDI->out_file_,_S_out);
    std::ofstream::~ofstream(local_208);
  }
  if ((Predict()::out == '\0') && (iVar3 = __cxa_guard_acquire(&Predict()::out), iVar3 != 0)) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x1b9460);
    __cxa_atexit(std::vector<float,_std::allocator<float>_>::~vector,&Predict::out,&__dso_handle);
    __cxa_guard_release(&Predict()::out);
  }
  local_210 = 0;
  (**(code **)(*(long *)(((_Vector_base<float,_std::allocator<float>_> *)&in_RDI->reader_)->_M_impl)
                        .super__Vector_impl_data._M_start + 0x28))();
  (*in_RDI->loss_->_vptr_Loss[7])();
  while (pfVar1 = (((_Vector_base<float,_std::allocator<float>_> *)&in_RDI->reader_)->_M_impl).
                  super__Vector_impl_data._M_start,
        uVar4 = (**(code **)(*(long *)pfVar1 + 0x20))(pfVar1,&local_210), uVar4 != 0) {
    uVar5 = (ulong)uVar4;
    sVar6 = std::vector<float,_std::allocator<float>_>::size(&Predict::out);
    if (uVar5 != sVar6) {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_RDI,uVar5);
    }
    siglen = &Predict::out;
    (*in_RDI->loss_->_vptr_Loss[3])(in_RDI->loss_,local_210,in_RDI->model_);
    bVar2 = Reader::has_label((Reader *)
                              (((_Vector_base<float,_std::allocator<float>_> *)&in_RDI->reader_)->
                              _M_impl).super__Vector_impl_data._M_start);
    if (bVar2) {
      (*in_RDI->loss_->_vptr_Loss[2])(in_RDI->loss_,&Predict::out,local_210 + 0x30);
    }
    if ((in_RDI->sigmoid_ & 1U) == 0) {
      if ((in_RDI->sign_ & 1U) != 0) {
        sign(in_RDI,(EVP_PKEY_CTX *)&Predict::out,(uchar *)&Predict::out,(size_t *)siglen,in_R8,
             in_R9);
      }
    }
    else {
      sigmoid(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    }
    std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffb58);
    __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
    __normal_iterator<float*>
              ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
               in_stack_fffffffffffffb60,
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
               in_stack_fffffffffffffb58);
    std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffb58);
    std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffb58);
    __position._M_current._4_4_ = in_stack_fffffffffffffbbc;
    __position._M_current._0_4_ = in_stack_fffffffffffffbb8;
    std::vector<float,std::allocator<float>>::
    insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
              (in_stack_fffffffffffffba0,__position,in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffba8);
    if ((in_RDI->res_out_ & 1U) != 0) {
      std::ofstream::ofstream(local_440,(string *)&in_RDI->out_file_,_S_app);
      for (in_stack_fffffffffffffbbc = 0; uVar5 = (ulong)in_stack_fffffffffffffbbc,
          sVar6 = std::vector<float,_std::allocator<float>_>::size(&Predict::out), uVar5 < sVar6;
          in_stack_fffffffffffffbbc = in_stack_fffffffffffffbbc + 1) {
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&Predict::out,(ulong)in_stack_fffffffffffffbbc);
        in_stack_fffffffffffffb60 = (ostream *)std::ostream::operator<<(local_440,*pvVar7);
        std::operator<<(in_stack_fffffffffffffb60,"\n");
      }
      std::ofstream::~ofstream(local_440);
    }
  }
  fVar8 = extraout_XMM0_Da;
  bVar2 = Reader::has_label((Reader *)
                            (((_Vector_base<float,_std::allocator<float>_> *)&in_RDI->reader_)->
                            _M_impl).super__Vector_impl_data._M_start);
  if (bVar2) {
    (*in_RDI->loss_->_vptr_Loss[6])();
    psVar9 = local_478;
    StringPrintf_abi_cxx11_((char *)(double)fVar8,psVar9,"The test loss is: %.6f");
    Color::print_info((string *)in_stack_fffffffffffffb60,SUB81((ulong)psVar9 >> 0x38,0));
    std::__cxx11::string::~string(local_478);
  }
  return;
}

Assistant:

void Predictor::Predict() {
  if (res_out_)
    std::ofstream o_file(out_file_);
  static std::vector<real_t> out;
  DMatrix* matrix = nullptr;
  reader_->Reset();
  loss_->Reset();
  for (;;) {
    index_t tmp = reader_->Samples(matrix);
    if (tmp == 0) { break; }
    if (tmp != out.size()) { out.resize(tmp); }
    loss_->Predict(matrix, *model_, out);
    if (reader_->has_label()) {
      loss_->Evalute(out, matrix->Y);
    }
    if (sigmoid_) {
      this->sigmoid(out, out);
    } else if (sign_) {
      this->sign(out, out);
    }
    this->out_.insert(this->out_.end(), out.begin(), out.end());
    if (res_out_) {
      std::ofstream o_file(out_file_, std::ofstream::app);
      for (index_t i = 0; i < out.size(); ++i) {
        o_file << out[i] << "\n";
      }
    }
  }
  if (reader_->has_label()) {
    Color::print_info(
      StringPrintf("The test loss is: %.6f", 
        loss_->GetLoss())
    );
  }
}